

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O1

Error * ot::commissioner::ReadHexStringFile
                  (Error *__return_storage_ptr__,ByteArray *aData,string *aFilename)

{
  char cVar1;
  ErrorCode EVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  _Alloc_hider _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  string hexString;
  ByteArray data;
  string local_98;
  ByteArray local_78;
  ByteArray *local_60;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60 = aData;
  ReadFile((Error *)local_58,&local_98,aFilename);
  __return_storage_ptr__->mCode = local_58._0_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_50);
  EVar2 = __return_storage_ptr__->mCode;
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  if (EVar2 != kNone) goto LAB_00122231;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_98._M_dataplus._M_p + local_98._M_string_length);
  _Var6._M_p = local_98._M_dataplus._M_p;
  if (0 < (long)local_98._M_string_length >> 2) {
    _Var6._M_p = local_98._M_dataplus._M_p + (local_98._M_string_length & 0xfffffffffffffffc);
    lVar4 = ((long)local_98._M_string_length >> 2) + 1;
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_98._M_dataplus._M_p + 3);
    do {
      iVar3 = isspace((int)paVar7->_M_local_buf[-3]);
      if (iVar3 != 0) {
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar7->_M_local_buf + -3);
        goto LAB_00122193;
      }
      iVar3 = isspace((int)paVar7->_M_local_buf[-2]);
      if (iVar3 != 0) {
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar7->_M_local_buf + -2);
        goto LAB_00122193;
      }
      iVar3 = isspace((int)paVar7->_M_local_buf[-1]);
      if (iVar3 != 0) {
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar7->_M_local_buf + -1);
        goto LAB_00122193;
      }
      iVar3 = isspace((int)paVar7->_M_local_buf[0]);
      if (iVar3 != 0) goto LAB_00122193;
      lVar4 = lVar4 + -1;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(paVar7->_M_local_buf + 4);
    } while (1 < lVar4);
  }
  lVar4 = (long)paVar8 - (long)_Var6._M_p;
  if (lVar4 == 1) {
LAB_0012216f:
    iVar3 = isspace((int)*_Var6._M_p);
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)_Var6._M_p;
    if (iVar3 == 0) {
      paVar7 = paVar8;
    }
  }
  else if (lVar4 == 2) {
LAB_0012215e:
    iVar3 = isspace((int)*_Var6._M_p);
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)_Var6._M_p;
    if (iVar3 == 0) {
      _Var6._M_p = _Var6._M_p + 1;
      goto LAB_0012216f;
    }
  }
  else {
    paVar7 = paVar8;
    if ((lVar4 == 3) &&
       (iVar3 = isspace((int)*_Var6._M_p),
       paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var6._M_p, iVar3 == 0)) {
      _Var6._M_p = _Var6._M_p + 1;
      goto LAB_0012215e;
    }
  }
LAB_00122193:
  pcVar5 = paVar7->_M_local_buf + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar8 && paVar7 != paVar8) {
    do {
      cVar1 = *pcVar5;
      iVar3 = isspace((int)cVar1);
      if (iVar3 == 0) {
        paVar7->_M_local_buf[0] = cVar1;
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar7->_M_local_buf + 1);
      }
      pcVar5 = pcVar5 + 1;
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pcVar5 != paVar8);
  }
  local_98._M_string_length = (long)paVar7 - (long)local_98._M_dataplus._M_p;
  paVar7->_M_local_buf[0] = '\0';
  utils::Hex((Error *)local_58,&local_78,&local_98);
  __return_storage_ptr__->mCode = local_58._0_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_50);
  EVar2 = __return_storage_ptr__->mCode;
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  if (EVar2 == kNone) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(local_60,&local_78);
  }
LAB_00122231:
  if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error ReadHexStringFile(ByteArray &aData, const std::string &aFilename)
{
    Error       error;
    std::string hexString;
    ByteArray   data;

    SuccessOrExit(error = ReadFile(hexString, aFilename));

    hexString.erase(std::remove_if(hexString.begin(), hexString.end(), [](int c) { return isspace(c); }),
                    hexString.end());
    SuccessOrExit(error = utils::Hex(data, hexString));

    aData = data;

exit:
    return error;
}